

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.c
# Opt level: O3

void calc_scalar(rt_function_t *f,float value,_func_float_float_float *calc_func)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  rt_list_t shape;
  
  shape._4_4_ = 0;
  shape.size = ((*f->outputs)->shape).size;
  shape.data = ((*f->outputs)->shape).data;
  uVar3 = calc_shape_size(shape);
  if (0 < (int)uVar3) {
    pvVar1 = (*f->inputs)->data;
    pvVar2 = (*f->outputs)->data;
    uVar4 = 0;
    do {
      fVar5 = (*calc_func)(*(float *)((long)pvVar1 + uVar4 * 4),value);
      *(float *)((long)pvVar2 + uVar4 * 4) = fVar5;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void calc_scalar(rt_function_t *f, float value,
                 float (*calc_func)(float, float)) {
  int out_size = calc_shape_size(f->outputs[0]->shape);
  float *input = f->inputs[0]->data;
  float *output = f->outputs[0]->data;
  int i; // Iterator
  for (i = 0; i < out_size; i++) {
    output[i] = calc_func(input[i], value);
  }
}